

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,std::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *args_1,
          optional<slang::ast::RandSeqProductionSymbol::ProdItem> *args_2)

{
  pointer pCVar1;
  size_t sVar2;
  undefined8 uVar3;
  RandSeqProductionSymbol *pRVar4;
  pointer ppEVar5;
  size_t sVar6;
  bool bVar7;
  undefined7 uVar8;
  CaseProd *pCVar9;
  
  pCVar9 = (CaseProd *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseProd *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (CaseProd *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  pCVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  bVar7 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>).
          _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
          _M_engaged;
  uVar8 = *(undefined7 *)
           &(args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
            )._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
            .field_0x21;
  uVar3 = *(undefined8 *)
           &(args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
            )._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
            ._M_payload;
  pRVar4 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>)
           ._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
           _M_payload._M_value.target;
  ppEVar5 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
            )._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
            ._M_payload._M_value.args._M_ptr;
  sVar6 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>).
          _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
          _M_payload._M_value.args._M_extent._M_extent_value;
  (pCVar9->super_ProdBase).kind = Case;
  (pCVar9->expr).ptr = args;
  (pCVar9->items)._M_ptr = pCVar1;
  (pCVar9->items)._M_extent._M_extent_value = sVar2;
  *(undefined8 *)
   &(pCVar9->defaultItem).
    super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload = uVar3;
  (pCVar9->defaultItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  target = pRVar4;
  (pCVar9->defaultItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  args._M_ptr = ppEVar5;
  (pCVar9->defaultItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  args._M_extent._M_extent_value = sVar6;
  (pCVar9->defaultItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_engaged = bVar7;
  *(undefined7 *)
   &(pCVar9->defaultItem).
    super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.field_0x21 = uVar8;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }